

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::quath>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *result)

{
  pointer *ppqVar1;
  pointer pqVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  char c;
  half4 v;
  char local_59;
  quath local_58;
  string local_50;
  
  pqVar2 = (result->
           super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
      _M_impl.super__Vector_impl_data._M_finish != pqVar2) {
    (result->super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
    _M_impl.super__Vector_impl_data._M_finish = pqVar2;
  }
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (bVar5) {
    bVar5 = ReadBasicType(this,(half4 *)&local_50);
    if (bVar5) {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_50._M_dataplus._M_p;
      auVar10 = pshuflw(auVar10,auVar10,0x39);
      local_58 = auVar10._0_8_;
      iVar3._M_current =
           (result->
           super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>::
        _M_realloc_insert<tinyusdz::value::quath_const&>
                  ((vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>> *)result,
                   iVar3,&local_58);
      }
      else {
        *iVar3._M_current = local_58;
        ppqVar1 = &(result->
                   super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppqVar1 = *ppqVar1 + 1;
      }
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_0037ec40;
        bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        bVar5 = Char1(this,&local_59);
        if (!bVar5) {
          return false;
        }
        if (local_59 == sep) {
          bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar5) {
            return false;
          }
          bVar5 = LookChar1(this,(char *)&local_50);
          if (!bVar5) {
            return false;
          }
          iVar6 = 3;
          if ((char)local_50._M_dataplus._M_p != end_symbol) goto LAB_0037ebab;
        }
        else {
LAB_0037ebab:
          if (local_59 != sep) {
            pSVar4 = this->_sr;
            if ((0 < (long)pSVar4->idx_) && (uVar7 = pSVar4->idx_ - 1, uVar7 <= pSVar4->length_)) {
              pSVar4->idx_ = uVar7;
            }
            goto LAB_0037ec40;
          }
          bVar5 = SkipWhitespaceAndNewline(this,true);
          if (!bVar5) {
            return false;
          }
          bVar5 = ReadBasicType(this,(half4 *)&local_50);
          if (bVar5) {
            auVar11._8_8_ = 0;
            auVar11._0_8_ = local_50._M_dataplus._M_p;
            auVar10 = pshuflw(auVar11,auVar11,0x39);
            local_58 = auVar10._0_8_;
            iVar3._M_current =
                 (result->
                 super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (result->
                super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>::
              _M_realloc_insert<tinyusdz::value::quath_const&>
                        ((vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>> *)
                         result,iVar3,&local_58);
            }
            else {
              *iVar3._M_current = local_58;
              ppqVar1 = &(result->
                         super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppqVar1 = *ppqVar1 + 1;
            }
            iVar6 = 0;
          }
          else {
            iVar6 = 3;
          }
        }
      } while (iVar6 == 0);
      if (iVar6 == 1) {
        return false;
      }
LAB_0037ec40:
      if ((result->
          super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (result->
          super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        return true;
      }
      pcVar9 = "Empty array.\n";
      pcVar8 = "";
    }
    else {
      pcVar9 = "Not starting with the value of requested type.\n";
      pcVar8 = "";
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar9,pcVar8);
    PushError(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}